

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImFontGlyph *pIVar12;
  ImFontGlyph *pIVar13;
  ulong uVar14;
  char *__function;
  long lVar15;
  float *pfVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  
  uVar17 = (this->Glyphs).Size;
  if ((ulong)uVar17 == 0) {
    uVar20 = 0;
  }
  else {
    lVar15 = 0;
    uVar19 = 0;
    if (0 < (int)uVar17) {
      uVar19 = uVar17;
    }
    uVar20 = 0;
    do {
      if (uVar19 <= uVar17 - 1) {
        __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
        goto LAB_001a9b3b;
      }
      uVar21 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar15) & 0x7fffffff;
      if (uVar21 < uVar20) {
        uVar21 = uVar20;
      }
      uVar20 = uVar21;
      lVar15 = lVar15 + 0x28;
    } while ((ulong)uVar17 * 0x28 != lVar15);
  }
  if (0xfffe < (int)uVar17) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                  ,0xb20,"void ImFont::BuildLookupTable()");
  }
  pfVar4 = (this->IndexAdvanceX).Data;
  if (pfVar4 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar4);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar5 = (this->IndexLookup).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar5);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar20 + 1);
  iVar2 = (this->Glyphs).Size;
  lVar15 = (long)iVar2;
  if (0 < lVar15) {
    pfVar4 = (this->IndexAdvanceX).Data;
    puVar5 = (this->IndexLookup).Data;
    pfVar16 = &((this->Glyphs).Data)->AdvanceX;
    lVar18 = 0;
    do {
      uVar17 = *(uint *)(pfVar16 + -1);
      uVar19 = uVar17 & 0x7fffffff;
      if ((this->IndexAdvanceX).Size <= (int)uVar19) goto LAB_001a9af8;
      pfVar4[uVar19] = *pfVar16;
      if ((this->IndexLookup).Size <= (int)uVar19) goto LAB_001a9b0f;
      puVar5[uVar19] = (unsigned_short)lVar18;
      this->Used4kPagesMap[uVar19 >> 0xf] =
           this->Used4kPagesMap[uVar19 >> 0xf] | (byte)(1 << ((byte)(uVar17 >> 0xc) & 7));
      lVar18 = lVar18 + 1;
      pfVar16 = pfVar16 + 10;
    } while (lVar15 != lVar18);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar13 == (ImFontGlyph *)0x0) {
LAB_001a9a1f:
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      pIVar13->field_0x3 = pIVar13->field_0x3 & 0x7f;
    }
    if (((uint)(this->IndexLookup).Size < 10) ||
       (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      pIVar13->field_0x3 = pIVar13->field_0x3 & 0x7f;
    }
    if ((ulong)this->FallbackChar < (ulong)(long)(this->IndexLookup).Size) {
      uVar1 = (this->IndexLookup).Data[this->FallbackChar];
      pIVar13 = (ImFontGlyph *)0x0;
      if (uVar1 != 0xffff) {
        pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
      }
    }
    else {
      pIVar13 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar13;
    fVar22 = 0.0;
    if (pIVar13 != (ImFontGlyph *)0x0) {
      fVar22 = pIVar13->AdvanceX;
    }
    this->FallbackAdvanceX = fVar22;
    pfVar4 = (this->IndexAdvanceX).Data;
    uVar14 = 0;
    while ((long)uVar14 < (long)(this->IndexAdvanceX).Size) {
      pfVar16 = pfVar4 + uVar14;
      if (*pfVar16 <= 0.0 && *pfVar16 != 0.0) {
        pfVar4[uVar14] = this->FallbackAdvanceX;
      }
      uVar14 = uVar14 + 1;
      if (uVar20 + 1 == uVar14) {
        return;
      }
    }
  }
  else {
    if (iVar2 < 1) {
LAB_001a9b45:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                    ,0x64e,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    if (((undefined1  [40])(this->Glyphs).Data[lVar15 + -1] & (undefined1  [40])0x7fffffff) !=
        (undefined1  [40])0x9) {
      uVar17 = iVar2 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= iVar2) {
        if (iVar3 == 0) {
          uVar19 = 8;
        }
        else {
          uVar19 = iVar3 / 2 + iVar3;
        }
        if ((int)uVar19 <= (int)uVar17) {
          uVar19 = uVar17;
        }
        if (iVar3 < (int)uVar19) {
          pIVar12 = (ImFontGlyph *)ImGui::MemAlloc((ulong)uVar19 * 0x28);
          pIVar13 = (this->Glyphs).Data;
          if (pIVar13 != (ImFontGlyph *)0x0) {
            memcpy(pIVar12,pIVar13,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar12;
          (this->Glyphs).Capacity = uVar19;
        }
      }
      (this->Glyphs).Size = uVar17;
    }
    lVar15 = (long)(this->Glyphs).Size;
    if (lVar15 < 1) goto LAB_001a9b45;
    pIVar13 = (this->Glyphs).Data;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    fVar22 = pIVar12->V1;
    pIVar13[lVar15 + -1].U1 = pIVar12->U1;
    pIVar13[lVar15 + -1].V1 = fVar22;
    uVar8 = *(undefined4 *)&pIVar12->field_0x0;
    fVar9 = pIVar12->AdvanceX;
    fVar10 = pIVar12->X0;
    fVar11 = pIVar12->Y0;
    fVar22 = pIVar12->Y1;
    fVar6 = pIVar12->U0;
    fVar7 = pIVar12->V0;
    pIVar13[lVar15 + -1].X1 = pIVar12->X1;
    pIVar13[lVar15 + -1].Y1 = fVar22;
    pIVar13[lVar15 + -1].U0 = fVar6;
    pIVar13[lVar15 + -1].V0 = fVar7;
    *(undefined4 *)&pIVar13[lVar15 + -1].field_0x0 = uVar8;
    pIVar13[lVar15 + -1].AdvanceX = fVar9;
    pIVar13[lVar15 + -1].X0 = fVar10;
    pIVar13[lVar15 + -1].Y0 = fVar11;
    *(uint *)(pIVar13 + lVar15 + -1) = *(uint *)(pIVar13 + lVar15 + -1) & 0x80000000 | 9;
    fVar22 = pIVar13[lVar15 + -1].AdvanceX * 4.0;
    pIVar13[lVar15 + -1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      if ((this->IndexLookup).Size <= (int)(*(uint *)(pIVar13 + lVar15 + -1) & 0x7fffffff)) {
LAB_001a9b0f:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_001a9b3b;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar13 + lVar15 + -1) & 0x7fffffff] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_001a9a1f;
    }
  }
LAB_001a9af8:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_001a9b3b:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                ,0x644,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}